

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::dump(basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,ostream *os,bool recursive)

{
  ostream *poVar1;
  byte byte;
  in_fake_critical_section *this_00;
  const_reference this_01;
  basic_node_ptr<unodb::detail::node_header> local_28;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  uint8_t i_1;
  uint8_t i;
  uchar children_count_;
  ostream *poStack_18;
  bool recursive_local;
  ostream *os_local;
  basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  
  local_19 = recursive;
  poStack_18 = os;
  os_local = (ostream *)this;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  ::dump((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          *)this,os,recursive);
  local_1a = in_fake_critical_section<unsigned_char>::load
                       (&(this->
                         super_basic_inode_16_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         ).
                         super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         .children_count);
  std::operator<<(poStack_18,", key bytes =");
  for (local_1b = 0; poVar1 = poStack_18, local_1b < local_1a; local_1b = local_1b + 1) {
    this_00 = (in_fake_critical_section *)
              std::array<unodb::in_fake_critical_section<std::byte>,_16UL>::operator[]
                        (&(this->keys).byte_array,(ulong)local_1b);
    byte = in_fake_critical_section::operator_cast_to_byte(this_00);
    dump_byte(poVar1,byte);
  }
  if ((local_19 & 1) != 0) {
    std::operator<<(poStack_18,", children:  \n");
    for (local_1c = 0; poVar1 = poStack_18, local_1c < local_1a; local_1c = local_1c + 1) {
      this_01 = std::
                array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_16UL>
                ::operator[](&this->children,(ulong)local_1c);
      local_28 = in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                 ::load(this_01);
      basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
      ::dump_node(poVar1,&local_28,true);
    }
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os,
                                                bool recursive) const {
    parent_class::dump(os, recursive);
    const auto children_count_ = this->children_count.load();
    os << ", key bytes =";
    for (std::uint8_t i = 0; i < children_count_; ++i)
      dump_byte(os, keys.byte_array[i]);
    if (recursive) {
      os << ", children:  \n";
      for (std::uint8_t i = 0; i < children_count_; ++i)
        ArtPolicy::dump_node(os, children[i].load());
    }
  }